

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_gnutar.c
# Opt level: O0

void test_write_format_gnutar(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  la_ssize_t lVar4;
  time_t v2;
  long v2_00;
  char *pcVar5;
  la_int64_t lVar6;
  char *pcVar7;
  size_t local_30;
  size_t used;
  archive *a;
  archive_entry *ae;
  char *buff;
  size_t buffsize;
  
  buff = (char *)0xf4240;
  ae = (archive_entry *)malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'j',(uint)(ae != (archive_entry *)0x0),"buff != NULL",(void *)0x0);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'm',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_gnutar((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'n',(uint)(iVar1 == 0),"0 == archive_write_set_format_gnutar(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'o',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",(void *)used);
  iVar1 = archive_write_open_memory((archive *)used,ae,(size_t)buff,&local_30);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'p',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'u',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,3,0x1e);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x7f',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x84',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,longfilename);
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used
                     );
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"abcdefgh",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x8a',8,"8",lVar4,"archive_write_data(a, \"abcdefgh\", 9)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x8f',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,longhardlinkname);
  archive_entry_copy_hardlink((archive_entry *)a,longfilename);
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used
                     );
  archive_entry_free((archive_entry *)a);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x9a',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,longlinkname);
  archive_entry_copy_symlink((archive_entry *)a,longfilename);
  archive_entry_set_mode((archive_entry *)a,0xa1ed);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x9e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used
                     );
  archive_entry_free((archive_entry *)a);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'¤',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"large_uid_gid");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  archive_entry_set_size((archive_entry *)a,8);
  archive_entry_set_uid((archive_entry *)a,0x75bcd15);
  archive_entry_set_gid((archive_entry *)a,0x3ade68b1);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ª',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  lVar4 = archive_write_data((archive *)used,"abcdefgh",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'¬',8,"8",lVar4,"archive_write_data(a, \"abcdefgh\", 9)",(void *)used);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'º',(void *)((long)&(ae->ae_fflags_text).aes_wcs.length + 1),"buff + 257",
                      "ustar  ","\"ustar  \\0\"",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'¼',0x3c00,"15360",local_30,"used",(void *)0x0);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Ã',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ä',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Å',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)used);
  iVar1 = archive_read_open_memory((archive *)used,ae,local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Æ',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ë',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  wVar2 = archive_entry_atime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Ì',(wVar2 != L'\0' ^ 0xff) & 1,"!archive_entry_atime_is_set(ae)",(void *)0x0)
  ;
  wVar2 = archive_entry_birthtime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Í',(wVar2 != L'\0' ^ 0xff) & 1,"!archive_entry_birthtime_is_set(ae)",
                   (void *)0x0);
  wVar2 = archive_entry_ctime_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Î',(wVar2 != L'\0' ^ 0xff) & 1,"!archive_entry_ctime_is_set(ae)",(void *)0x0)
  ;
  v2 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ï',5,"5",v2,"archive_entry_mtime(ae)",(void *)0x0);
  v2_00 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ð',0,"0",v2_00,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'Ñ',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ò',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ó',8,"8",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ô',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Õ',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ú',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  pcVar5 = longfilename;
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'Û',pcVar5,"longfilename",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ü',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ý',8,"8",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar4 = archive_read_data((archive *)used,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Þ',8,"8",lVar4,"archive_read_data(a, buff2, 10)",(void *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ß',buff2,"buff2","abcdefgh","\"abcdefgh\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ä',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  pcVar5 = longhardlinkname;
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'å',pcVar5,"longhardlinkname",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  pcVar5 = longfilename;
  pcVar7 = archive_entry_hardlink((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'æ',pcVar5,"longfilename",pcVar7,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ë',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  pcVar5 = longlinkname;
  pcVar7 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'ì',pcVar5,"longlinkname",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar5 = longfilename;
  pcVar7 = archive_entry_symlink((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'í',pcVar5,"longfilename",pcVar7,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'î',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ó',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ô',0x75bcd15,"123456789",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'õ',0x3ade68b1,"987654321",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'ö',"large_uid_gid","\"large_uid_gid\"",pcVar5,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'÷',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ü',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)used);
  iVar1 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)used);
  iVar1 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'þ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)used);
  free(ae);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_gnutar)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae;
	struct archive *a;
	size_t used;

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_gnutar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file" has a bunch of attributes and 8 bytes of data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * A file with a very long name
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longfilename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "abcdefgh", 9));

	/*
	 * A hardlink to the above file.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longhardlinkname);
	archive_entry_copy_hardlink(ae, longfilename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * A symlink to the above file.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longlinkname);
	archive_entry_copy_symlink(ae, longfilename);
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * A file with large UID/GID that overflow octal encoding.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "large_uid_gid");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	archive_entry_set_uid(ae, 123456789);
	archive_entry_set_gid(ae, 987654321);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "abcdefgh", 9));

	/* TODO: support GNU tar sparse format and test it here. */
	/* See test_write_format_pax for an example of testing sparse files. */

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	/*
	 * Some basic verification of the low-level format.
	 */

	/* Verify GNU tar magic/version fields */
	assertEqualMem(buff + 257, "ustar  \0", 8);

	assertEqualInt(15360, used);

	/*
	 *
	 * Now, read the data back.
	 *
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read "file"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_birthtime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read file with very long name.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longfilename, archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "abcdefgh", 8);

	/*
	 * Read hardlink.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longhardlinkname, archive_entry_pathname(ae));
	assertEqualString(longfilename, archive_entry_hardlink(ae));

	/*
	 * Read symlink.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longlinkname, archive_entry_pathname(ae));
	assertEqualString(longfilename, archive_entry_symlink(ae));
	assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));

	/*
	 * Read file with large UID/GID.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(123456789, archive_entry_uid(ae));
	assertEqualInt(987654321, archive_entry_gid(ae));
	assertEqualString("large_uid_gid", archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}